

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

vector<Tle,_std::allocator<Tle>_> *
readTLEs(vector<Tle,_std::allocator<Tle>_> *__return_storage_ptr__,string *fname,FILE *fp)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 uVar5;
  string name;
  string line1;
  string line2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  ulong local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tle,_std::allocator<Tle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_98 = 0;
  do {
    bVar1 = readLine(fp,&local_b8);
    if (!bVar1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
      return __return_storage_ptr__;
    }
    iVar2 = isalpha((int)*local_b8._M_dataplus._M_p);
    if ((iVar2 != 0) || (local_b8._M_string_length < 0x19)) {
      std::__cxx11::string::_M_assign((string *)&local_d8);
    }
    lVar3 = std::__cxx11::string::find_last_not_of((char *)&local_d8,0x11575d,0xffffffffffffffff);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_d8);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    if (0x16 < local_d8._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_d8);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = readLine(fp,&local_b8);
    if (bVar1) {
      bVar1 = readLine(fp,&local_70);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unexpected error reading TLE line 2 at line ",0x2c);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(fname->_M_dataplus)._M_p,fname->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        uVar5 = std::ostream::flush();
        goto LAB_0010936e;
      }
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_b8);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
      std::vector<Tle,std::allocator<Tle>>::
      emplace_back<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string>
                ((vector<Tle,std::allocator<Tle>> *)__return_storage_ptr__,&local_d8,&local_90,
                 &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_d8._M_string_length = 0;
      *local_d8._M_dataplus._M_p = '\0';
      bVar1 = true;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unexpected error reading TLE line 1 at line ",0x2c);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," in ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(fname->_M_dataplus)._M_p,fname->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      uVar5 = std::ostream::flush();
LAB_0010936e:
      local_98 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
      bVar1 = false;
    }
    if (!bVar1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      if ((local_98 & 1) == 0) {
        std::vector<Tle,_std::allocator<Tle>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static std::vector<Tle> readTLEs(const std::string &fname, FILE *fp) {
  std::vector<Tle> tles;
  std::string line1, line2, name;
  size_t lineNo = 0;

  while (readLine(fp, line1)) {
    ++lineNo;
    if (std::isalpha(line1[0]) || line1.size() <= 24)
      name = line1;
    // Trim trailing whitespace from name.
    auto en = name.find_last_not_of(" \t\r\n");
    if (en != std::string::npos)
      name = name.substr(0, en + 1);
    // Celestrak and wikipedia say that names are 24 bytes, libsgp4 says 22.
    if (name.size() > 22)
      name = name.substr(0, 22);
    ++lineNo;
    if (!readLine(fp, line1)) {
      std::cerr << "Unexpected error reading TLE line 1 at line " << lineNo
                << " in " << fname << std::endl;
      return tles;
    }
    ++lineNo;
    if (!readLine(fp, line2)) {
      std::cerr << "Unexpected error reading TLE line 2 at line " << lineNo
                << " in " << fname << std::endl;
      return tles;
    }

    tles.emplace_back(name, line1.substr(0, 69), line2.substr(0, 69));
    name.clear();
  }

  return tles;
}